

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool jsonip::parser::
     seq_<jsonip::grammar::member_,jsonip::parser::star_<jsonip::parser::seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  bool bVar1;
  
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::push_state(state);
  bVar1 = seq_<jsonip::grammar::member_name,jsonip::grammar::spaces_,jsonip::parser::colon,jsonip::grammar::spaces_,jsonip::grammar::atom,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
  ;
  if ((bVar1) &&
     (bVar1 = star_<jsonip::parser::seq_<jsonip::grammar::spaces_,jsonip::parser::comma,jsonip::grammar::spaces_,jsonip::grammar::member_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>>
              ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                        (state), bVar1)) {
    ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::commit(state);
    return true;
  }
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::rollback(state);
  return false;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) && C1::match(state) &&
                       C2::match(state) && C3::match(state) &&
                       C4::match(state) && C5::match(state) &&
                       C6::match(state) && C7::match(state);
            var ? state.commit() : state.rollback();

            return var;
        }